

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *args,int numArgs)

{
  _func_int *p_Var1;
  uint *puVar2;
  undefined4 uVar3;
  long lVar4;
  _func_int *p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  _func_int **pp_Var8;
  long lVar9;
  runtime_error *prVar10;
  size_type sVar11;
  size_type sVar12;
  char *fmtStart;
  long in_FS_OFFSET;
  undefined1 local_205;
  int ntrunc;
  bool spacePadPositive;
  int argIndex;
  bool positionalMode;
  string result;
  ostringstream tmpStream;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var5 = out->_vptr_basic_ostream[-3];
  p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)p_Var5);
  uVar6 = *(undefined8 *)(&out->field_0x8 + (long)p_Var5);
  uVar7 = *(undefined8 *)(&out->field_0x10 + (long)p_Var5);
  uVar3 = *(undefined4 *)(&out->field_0x18 + (long)p_Var5);
  if ((&out->field_0xe1)[(long)p_Var5] == '\x01') {
    local_205 = p_Var1[0xe0];
  }
  else {
    local_205 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = local_205;
    p_Var1[0xe1] = (code)0x1;
  }
  positionalMode = false;
  argIndex = 0;
  fmtStart = fmt;
  do {
    for (; *fmtStart == '%'; fmtStart = fmtStart + 1) {
      std::ostream::write((char *)out,(long)fmt);
      if (fmtStart[1] != '%') goto LAB_00253378;
      fmt = fmtStart + 1;
      fmtStart = fmt;
LAB_00253373:
    }
    if (*fmtStart != '\0') goto LAB_00253373;
    std::ostream::write((char *)out,(long)fmt);
LAB_00253378:
    if (*fmtStart == '\0') {
      if ((positionalMode == false) && (argIndex < numArgs)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tmpStream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)&tmpStream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&tmpStream,
                   "tinyformat: Not enough conversion specifiers in format string","");
        std::runtime_error::runtime_error(prVar10,(string *)&tmpStream);
        *(undefined ***)prVar10 = &PTR__runtime_error_01388e60;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
          __cxa_throw(prVar10,&format_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        pp_Var8 = out->_vptr_basic_ostream;
        *(undefined8 *)(&out->field_0x10 + (long)pp_Var8[-3]) = uVar7;
        *(undefined8 *)(&out->field_0x8 + (long)pp_Var8[-3]) = uVar6;
        *(undefined4 *)(&out->field_0x18 + (long)pp_Var8[-3]) = uVar3;
        p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var8[-3]);
        if ((&out->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
          std::ios::widen((char)p_Var1);
          p_Var1[0xe1] = (code)0x1;
        }
        p_Var1[0xe0] = local_205;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
          return;
        }
      }
      goto LAB_00253753;
    }
    spacePadPositive = false;
    ntrunc = -1;
    fmt = streamStateFromFormat
                    (out,&positionalMode,&spacePadPositive,&ntrunc,fmtStart,args,&argIndex,numArgs);
    lVar9 = (long)argIndex;
    if (numArgs <= argIndex) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      tmpStream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&tmpStream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tmpStream,"tinyformat: Too many conversion specifiers in format string",
                 "");
      std::runtime_error::runtime_error(prVar10,(string *)&tmpStream);
      *(undefined ***)prVar10 = &PTR__runtime_error_01388e60;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        __cxa_throw(prVar10,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00253753:
      __stack_chk_fail();
    }
    if (spacePadPositive == false) {
      FormatArg::format(args + lVar9,out,fmtStart,fmt,ntrunc);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmpStream);
      std::ios::copyfmt((ios *)(tmpStream.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream[-3] + (long)&tmpStream));
      puVar2 = (uint *)(&tmpStream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 +
                       (long)tmpStream.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream[-3]);
      *puVar2 = *puVar2 | 0x800;
      FormatArg::format(args + lVar9,(ostream *)&tmpStream,fmtStart,fmt,ntrunc);
      std::__cxx11::stringbuf::str();
      if (result._M_string_length == 0) {
        sVar12 = 0;
      }
      else {
        sVar11 = 0;
        do {
          if (result._M_dataplus._M_p[sVar11] == '+') {
            result._M_dataplus._M_p[sVar11] = ' ';
          }
          sVar11 = sVar11 + 1;
          sVar12 = result._M_string_length;
        } while (result._M_string_length != sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,result._M_dataplus._M_p,sVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmpStream);
      std::ios_base::~ios_base
                ((ios_base *)
                 &tmpStream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    }
    fmtStart = fmt;
    if (positionalMode == false) {
      argIndex = argIndex + 1;
    }
  } while( true );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* args,
                       int numArgs)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    // "Positional mode" means all format specs should be of the form "%n$..."
    // with `n` an integer. We detect this in `streamStateFromFormat`.
    bool positionalMode = false;
    int argIndex = 0;
    while (true) {
        fmt = printFormatStringLiteral(out, fmt);
        if (*fmt == '\0') {
            if (!positionalMode && argIndex < numArgs) {
                TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
            }
            break;
        }
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, positionalMode, spacePadPositive, ntrunc, fmt,
                                                   args, argIndex, numArgs);
        // NB: argIndex may be incremented by reading variable width/precision
        // in `streamStateFromFormat`, so do the bounds check here.
        if (argIndex >= numArgs) {
            TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");
            return;
        }
        const FormatArg& arg = args[argIndex];
        // Format the arg into the stream.
        if (!spacePadPositive) {
            arg.format(out, fmt, fmtEnd, ntrunc);
        }
        else {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for (size_t i = 0, iend = result.size(); i < iend; ++i) {
                if (result[i] == '+')
                    result[i] = ' ';
            }
            out << result;
        }
        if (!positionalMode)
            ++argIndex;
        fmt = fmtEnd;
    }

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}